

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O3

void __thiscall
jetbrains::teamcity::anon_unknown_1::RaiiMessage::writeProperty
          (RaiiMessage *this,char *name,string *value)

{
  pointer pcVar1;
  ostream *poVar2;
  size_t sVar3;
  ulong uVar4;
  byte local_71;
  char *local_70;
  long local_68;
  char local_60;
  undefined7 uStack_5f;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_70 = (char *)CONCAT71(local_70._1_7_,0x20);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_70,1);
  if (name == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,name,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\'",2);
  local_50 = local_40;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + value->_M_string_length);
  local_70 = &local_60;
  local_68 = 0;
  local_60 = '\0';
  if (local_48 != 0) {
    uVar4 = 0;
    do {
      local_71 = *(byte *)((long)local_50 + uVar4);
      if (local_71 < 0x27) {
        if ((local_71 != 10) && (local_71 != 0xd)) goto LAB_0010257f;
LAB_001025a8:
        std::__cxx11::string::append((char *)&local_70);
      }
      else {
        if ((local_71 == 0x27) || ((local_71 == 0x5d || (local_71 == 0x7c)))) goto LAB_001025a8;
LAB_0010257f:
        std::__cxx11::string::append((char *)&local_70,(ulong)&local_71);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_48);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_70,local_68);
  local_71 = 0x27;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_71,1);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void writeProperty(const char* const name, const std::string value)
    {
        m_out << ' ' << name << "='" << escape(value) << '\'';
    }